

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_transform.c
# Opt level: O0

void gdImageFlipHorizontal(gdImagePtr im)

{
  uchar uVar1;
  int iVar2;
  uchar *puStack_40;
  uchar tmp_1;
  uchar *px2_1;
  uchar *px1_1;
  int *piStack_28;
  int tmp;
  int *px2;
  int *px1;
  int y;
  int x;
  gdImagePtr im_local;
  
  if (im->trueColor == 0) {
    for (px1._0_4_ = 0; (int)px1 < im->sy; px1._0_4_ = (int)px1 + 1) {
      px2_1 = im->pixels[(int)px1];
      puStack_40 = im->pixels[(int)px1] + im->sx;
      for (px1._4_4_ = 0; puStack_40 = puStack_40 + -1, px1._4_4_ < im->sx >> 1;
          px1._4_4_ = px1._4_4_ + 1) {
        uVar1 = *px2_1;
        *px2_1 = *puStack_40;
        *puStack_40 = uVar1;
        px2_1 = px2_1 + 1;
      }
    }
  }
  else {
    for (px1._0_4_ = 0; (int)px1 < im->sy; px1._0_4_ = (int)px1 + 1) {
      px2 = im->tpixels[(int)px1];
      piStack_28 = im->tpixels[(int)px1] + im->sx;
      for (px1._4_4_ = 0; piStack_28 = piStack_28 + -1, px1._4_4_ < im->sx >> 1;
          px1._4_4_ = px1._4_4_ + 1) {
        iVar2 = *px2;
        *px2 = *piStack_28;
        *piStack_28 = iVar2;
        px2 = px2 + 1;
      }
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFlipHorizontal(gdImagePtr im)
{

	int x, y;

	if (im->trueColor) {
		int *px1, *px2, tmp;

		for (y = 0; y < im->sy; y++) {
			px1 = im->tpixels[y];
			px2 = im->tpixels[y] + im->sx - 1;
			for (x = 0; x < (im->sx >> 1); x++) {
				tmp = *px1;
				*px1 = *px2;
				*px2 = tmp;
				px1++;
				px2--;
			}
		}
	} else {
		unsigned char *px1, *px2, tmp;

		for (y = 0; y < im->sy; y++) {
			px1 = im->pixels[y];
			px2 = im->pixels[y] + im->sx - 1;
			for (x = 0; x < (im->sx >> 1); x++) {
				tmp = *px1;
				*px1 = *px2;
				*px2 = tmp;
				px1++;
				px2--;
			}
		}
	}
}